

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void CheckRequiredOrDefault(RPCArg *param)

{
  __index_type _Var1;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar2;
  long in_FS_OFFSET;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = *(__index_type *)
           ((long)&(param->m_fallback).
                   super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                   .
                   super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
           + 0x58);
  if (_Var1 == '\0') {
    pvVar2 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&param->m_fallback);
    if (*pvVar2 == NO) {
      local_11 = true;
      goto LAB_005b9b6d;
    }
    _Var1 = *(__index_type *)
             ((long)&(param->m_fallback).
                     super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                     .
                     super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                     .
                     super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
             + 0x58);
  }
  local_11 = _Var1 == '\x02';
LAB_005b9b6d:
  inline_check_non_fatal<bool>
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x2c8,"CheckRequiredOrDefault",
             "required || std::holds_alternative<RPCArg::Default>(param.m_fallback)");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckRequiredOrDefault(const RPCArg& param)
{
    // Must use `Arg<Type>(key)` to get the argument or its default value.
    const bool required{
        std::holds_alternative<RPCArg::Optional>(param.m_fallback) && RPCArg::Optional::NO == std::get<RPCArg::Optional>(param.m_fallback),
    };
    CHECK_NONFATAL(required || std::holds_alternative<RPCArg::Default>(param.m_fallback));
}